

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::StairsRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLogLog>::operator()
          (StairsRenderer<ImPlot::GetterYs<int>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<int> *pGVar7;
  TransformerLogLog *pTVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  pIVar16 = GImPlot;
  pGVar7 = this->Getter;
  pTVar8 = this->Transformer;
  iVar17 = pGVar7->Count;
  iVar17 = *(int *)((long)pGVar7->Ys +
                   (long)(((prim + 1 + pGVar7->Offset) % iVar17 + iVar17) % iVar17) *
                   (long)pGVar7->Stride);
  dVar12 = log10(((double)(prim + 1) * pGVar7->XScale + pGVar7->X0) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar9->XAxis).Range.Min;
  dVar3 = (pIVar9->XAxis).Range.Max;
  dVar13 = log10((double)iVar17 / pIVar9->YAxis[pTVar8->YAxis].Range.Min);
  iVar17 = pTVar8->YAxis;
  pIVar9 = pIVar16->CurrentPlot;
  auVar21._8_8_ = dVar13;
  auVar21._0_8_ = dVar12;
  auVar22._8_4_ = SUB84(pIVar16->LogDenY[iVar17],0);
  auVar22._0_8_ = dVar1;
  auVar22._12_4_ = (int)((ulong)pIVar16->LogDenY[iVar17] >> 0x20);
  auVar22 = divpd(auVar21,auVar22);
  dVar1 = pIVar9->YAxis[iVar17].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar17].Min;
  fVar18 = (float)(pIVar16->Mx *
                   (((double)(float)auVar22._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar9->XAxis).Range.Min) + (double)IVar4.x);
  fVar19 = (float)(pIVar16->My[iVar17] *
                   (((double)(float)auVar22._8_8_ * (pIVar9->YAxis[iVar17].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar20 = (this->P1).x;
  fVar23 = (this->P1).y;
  auVar25._0_4_ = ~-(uint)(fVar18 <= fVar20) & (uint)fVar18;
  auVar25._4_4_ = ~-(uint)(fVar19 <= fVar23) & (uint)fVar19;
  auVar25._8_4_ = ~-(uint)(fVar20 < fVar18) & (uint)fVar18;
  auVar25._12_4_ = ~-(uint)(fVar23 < fVar19) & (uint)fVar19;
  auVar14._4_4_ = (uint)fVar23 & -(uint)(fVar19 <= fVar23);
  auVar14._0_4_ = (uint)fVar20 & -(uint)(fVar18 <= fVar20);
  auVar14._8_4_ = (uint)fVar20 & -(uint)(fVar20 < fVar18);
  auVar14._12_4_ = (uint)fVar23 & -(uint)(fVar23 < fVar19);
  auVar25 = auVar25 | auVar14;
  fVar24 = (cull_rect->Min).y;
  auVar15._4_8_ = auVar25._8_8_;
  auVar15._0_4_ = -(uint)(auVar25._4_4_ < fVar24);
  auVar26._0_8_ = auVar15._0_8_ << 0x20;
  auVar26._8_4_ = -(uint)(auVar25._8_4_ < (cull_rect->Max).x);
  auVar26._12_4_ = -(uint)(auVar25._12_4_ < (cull_rect->Max).y);
  auVar27._4_4_ = -(uint)(fVar24 < auVar25._4_4_);
  auVar27._0_4_ = -(uint)((cull_rect->Min).x < auVar25._0_4_);
  auVar27._8_8_ = auVar26._8_8_;
  iVar17 = movmskps((int)pIVar9,auVar27);
  if (iVar17 == 0xf) {
    fVar24 = fVar23 + this->HalfWeight;
    fVar23 = fVar23 - this->HalfWeight;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = fVar20;
    (pIVar10->pos).y = fVar24;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar18;
    pIVar10[1].pos.y = fVar23;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar20;
    pIVar10[2].pos.y = fVar23;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar18;
    pIVar10[3].pos.y = fVar24;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar6;
    puVar11[1] = uVar6 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar6;
    puVar11[4] = uVar6 + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
    fVar23 = fVar18 - this->HalfWeight;
    fVar20 = this->HalfWeight + fVar18;
    fVar24 = (this->P1).y;
    IVar5 = this->Col;
    IVar4 = *uv;
    pIVar10[4].pos.x = fVar23;
    pIVar10[4].pos.y = fVar19;
    DrawList->_VtxWritePtr->uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar20;
    pIVar10[1].pos.y = fVar24;
    DrawList->_VtxWritePtr[1].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar23;
    pIVar10[2].pos.y = fVar24;
    pIVar10[2].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = fVar20;
    pIVar10[3].pos.y = fVar19;
    pIVar10[3].uv = IVar4;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = uVar6;
    puVar11[1] = uVar6 + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    uVar6 = DrawList->_VtxCurrentIdx;
    puVar11[3] = uVar6;
    puVar11[4] = uVar6 + 1;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar4.y = fVar19;
  IVar4.x = fVar18;
  this->P1 = IVar4;
  return (char)iVar17 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddRectFilled(ImVec2(P1.x, P1.y + HalfWeight), ImVec2(P2.x, P1.y - HalfWeight), Col, DrawList, uv);
        AddRectFilled(ImVec2(P2.x - HalfWeight, P2.y), ImVec2(P2.x + HalfWeight, P1.y), Col, DrawList, uv);

        // AddLine(P1, P12, Weight, Col, DrawList, uv);
        // AddLine(P12, P2, Weight, Col, DrawList, uv);
        P1 = P2;
        return true;
    }